

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O3

int Cudd_DumpDDcal(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  int *piVar1;
  size_t __size;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  st__table *visited;
  st__generator *gen;
  void *__s;
  DdNode *pDVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  DdNode *local_48;
  char **local_40;
  char **local_38;
  
  iVar4 = dd->size;
  visited = st__init_table(st__ptrcmp,st__ptrhash);
  if (visited == (st__table *)0x0) {
    return 0;
  }
  local_38 = inames;
  if (0 < n) {
    uVar9 = 0;
    do {
      iVar3 = cuddCollectNodes((DdNode *)((ulong)f[uVar9] & 0xfffffffffffffffe),visited);
      if (iVar3 == 0) goto LAB_008f2e51;
      uVar9 = uVar9 + 1;
    } while ((uint)n != uVar9);
  }
  pDVar5 = *f;
  local_40 = onames;
  gen = st__init_gen(visited);
  iVar3 = st__gen(gen,(char **)&local_48,(char **)0x0);
  uVar9 = 0;
  if (iVar3 != 0) {
    uVar9 = 0;
    do {
      uVar9 = uVar9 | (ulong)local_48 ^ (ulong)pDVar5 & 0xfffffffffffffffe;
      iVar3 = st__gen(gen,(char **)&local_48,(char **)0x0);
    } while (iVar3 != 0);
  }
  st__free_gen(gen);
  uVar8 = 0;
  do {
    uVar7 = ~(-1 << ((byte)uVar8 & 0x1f));
    if (uVar9 <= uVar7) break;
    bVar10 = uVar8 < 0x3c;
    uVar8 = uVar8 + 4;
  } while (bVar10);
  st__free_table(visited);
  __size = (long)iVar4 * 4;
  __s = malloc(__size);
  if (__s == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    return 0;
  }
  if (0 < iVar4) {
    memset(__s,0,__size);
  }
  pDVar5 = Cudd_VectorSupport(dd,f,n);
  ppcVar2 = local_38;
  if (pDVar5 == (DdNode *)0x0) {
LAB_008f2df5:
    free(__s);
    return 0;
  }
  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  uVar8 = pDVar5->index;
  local_48 = pDVar5;
  while (uVar8 != 0x7fffffff) {
    *(undefined4 *)((long)__s + (ulong)uVar8 * 4) = 1;
    local_48 = (local_48->type).kids.T;
    uVar8 = local_48->index;
  }
  Cudd_RecursiveDeref(dd,pDVar5);
  if (0 < iVar4) {
    uVar9 = 0;
    do {
      if (*(int *)((long)__s + (long)dd->invperm[uVar9] * 4) != 0) {
        if ((ppcVar2 == (char **)0x0) ||
           (pcVar6 = ppcVar2[dd->invperm[uVar9]], pcVar6 == (char *)0x0)) {
          iVar3 = fprintf((FILE *)fp,"v%d");
        }
        else {
          iVar3 = fprintf((FILE *)fp,"%s",pcVar6);
        }
        if (iVar3 == -1) goto LAB_008f2df5;
      }
      pcVar6 = " * ";
      if (iVar4 - 1 == uVar9) {
        pcVar6 = "\n";
      }
      iVar3 = fprintf((FILE *)fp,"%s",pcVar6);
      if (iVar3 == -1) goto LAB_008f2df5;
      uVar9 = uVar9 + 1;
    } while ((long)iVar4 != uVar9);
  }
  free(__s);
  visited = st__init_table(st__ptrcmp,st__ptrhash);
  if (visited == (st__table *)0x0) {
    return 0;
  }
  if (n < 1) {
    iVar4 = fprintf((FILE *)fp,"[");
    if (iVar4 == -1) goto LAB_008f2e51;
  }
  else {
    uVar9 = 0;
    do {
      iVar4 = ddDoDumpDDcal(dd,(DdNode *)((ulong)f[uVar9] & 0xfffffffffffffffe),fp,visited,local_38,
                            (ulong)uVar7);
      if (iVar4 == 0) goto LAB_008f2e51;
      if (local_40 == (char **)0x0) {
        iVar4 = fprintf((FILE *)fp,"f%d = ",uVar9 & 0xffffffff);
      }
      else {
        iVar4 = fprintf((FILE *)fp,"%s = ",local_40[uVar9]);
      }
      if (iVar4 == -1) goto LAB_008f2e51;
      pcVar6 = "\'";
      if (((ulong)f[uVar9] & 1) == 0) {
        pcVar6 = "";
      }
      iVar4 = fprintf((FILE *)fp,"n%p%s\n",(ulong)(uVar7 & (uint)f[uVar9]) / 0x28,pcVar6);
      if (iVar4 == -1) goto LAB_008f2e51;
      uVar9 = uVar9 + 1;
    } while ((uint)n != uVar9);
    iVar4 = fprintf((FILE *)fp,"[");
    if (iVar4 == -1) goto LAB_008f2e51;
    if (0 < n) {
      uVar9 = 0;
      do {
        if (local_40 == (char **)0x0) {
          fprintf((FILE *)fp,"f%d",uVar9 & 0xffffffff);
        }
        else {
          fputs(local_40[uVar9],(FILE *)fp);
        }
        pcVar6 = " ";
        if (n - 1 == uVar9) {
          pcVar6 = "";
        }
        iVar4 = fprintf((FILE *)fp,"%s",pcVar6);
        if (iVar4 == -1) goto LAB_008f2e51;
        uVar9 = uVar9 + 1;
      } while ((uint)n != uVar9);
    }
  }
  iVar4 = fprintf((FILE *)fp,"]\n");
  if (iVar4 != -1) {
    st__free_table(visited);
    return 1;
  }
LAB_008f2e51:
  st__free_table(visited);
  return 0;
}

Assistant:

int
Cudd_DumpDDcal(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode        *support = NULL;
    DdNode        *scan;
    int           *sorted = NULL;
    int           nvars = dd->size;
    st__table      *visited = NULL;
    int           retval;
    int           i;
    st__generator  *gen;
    ptruint       refAddr, diff, mask;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(Cudd_Regular(f[i]),visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (ptruint) Cudd_Regular(f[0]);
    diff = 0;
    gen = st__init_gen(visited);
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (ptruint) scan;
    }
    st__free_gen(gen);

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(ptruint); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }
    st__free_table(visited);
    visited = NULL;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    support = Cudd_VectorSupport(dd,f,n);
    if (support == NULL) goto failure;
    cuddRef(support);
    scan = support;
    while (!cuddIsConstant(scan)) {
        sorted[scan->index] = 1;
        scan = cuddT(scan);
    }
    Cudd_RecursiveDeref(dd,support);
    support = NULL; /* so that we do not try to free it in case of failure */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            if (inames == NULL || inames[dd->invperm[i]] == NULL) {
                retval = fprintf(fp,"v%d", dd->invperm[i]);
            } else {
                retval = fprintf(fp,"%s", inames[dd->invperm[i]]);
            }
            if (retval == EOF) goto failure;
        }
        retval = fprintf(fp,"%s", i == nvars - 1 ? "\n" : " * ");
        if (retval == EOF) goto failure;
    }
    ABC_FREE(sorted);
    sorted = NULL;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        retval = ddDoDumpDDcal(dd,Cudd_Regular(f[i]),fp,visited,inames,mask);
        if (retval == 0) goto failure;
        if (onames == NULL) {
            retval = fprintf(fp, "f%d = ", i);
        } else {
            retval = fprintf(fp, "%s = ", onames[i]);
        }
        if (retval == EOF) goto failure;
        retval = fprintf(fp, "n%p%s\n",
                         (void *) (((ptruint) f[i] & mask) /
                         (ptruint) sizeof(DdNode)),
                         Cudd_IsComplement(f[i]) ? "'" : "");
        if (retval == EOF) goto failure;
    }

    /* Write trailer and return. */
    retval = fprintf(fp, "[");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp, "f%d", i);
        } else {
            retval = fprintf(fp, "%s", onames[i]);
        }
        retval = fprintf(fp, "%s", i == n-1 ? "" : " ");
        if (retval == EOF) goto failure;
    }
    retval = fprintf(fp, "]\n");
    if (retval == EOF) goto failure;

    if ( visited )
        st__free_table(visited);
    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    if (visited != NULL) st__free_table(visited);
    return(0);

}